

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmIf::gen_code(CTPNStmIf *this,int param_2,int param_3)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  CTcConstVal *this_00;
  CTcCodeLabel *pCVar4;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CTPNStmBase *in_RDI;
  CTcCodeLabel *lbl_end_1;
  CTcCodeLabel *lbl_end;
  CTcCodeLabel *lbl_else;
  int val;
  CTcCodeStream *in_stack_ffffffffffffffd0;
  CTcCodeLabel *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_stack_ffffffffffffffd0);
  iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x28975c);
  if (iVar2 == 0) {
    if ((in_RDI[1].next_stm_ == (CTPNStm *)0x0) && (in_RDI[1].file_ == (CTcTokFileDesc *)0x0)) {
      pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      (**(code **)*pp_Var1)(pp_Var1,1);
    }
    else if (in_RDI[1].next_stm_ == (CTPNStm *)0x0) {
      pCVar4 = CTcCodeStream::new_label_fwd(in_stack_ffffffffffffffd0);
      pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      (**(code **)(*pp_Var1 + 0xa0))(pp_Var1,pCVar4,0);
      CTPNStmBase::gen_code_substm
                ((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),
                 (CTPNStm *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      CTcPrsNode::def_label_pos(in_stack_ffffffffffffffe0);
    }
    else {
      pCVar4 = CTcCodeStream::new_label_fwd(in_stack_ffffffffffffffd0);
      pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      (**(code **)(*pp_Var1 + 0xa0))(pp_Var1,0,pCVar4);
      CTPNStmBase::gen_code_substm
                ((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),
                 (CTPNStm *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (in_RDI[1].file_ == (CTcTokFileDesc *)0x0) {
        CTcPrsNode::def_label_pos(pCVar4);
      }
      else {
        CTcPrsNode::gen_jump_ahead((uchar)((ulong)in_RDI >> 0x38));
        CTcPrsNode::def_label_pos(pCVar4);
        CTPNStmBase::gen_code_substm
                  ((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),
                   (CTPNStm *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        CTcPrsNode::def_label_pos(pCVar4);
      }
    }
  }
  else {
    (**(code **)(*in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 8))();
    iVar2 = CTcConstVal::get_val_bool((CTcConstVal *)in_stack_ffffffffffffffd0);
    if (iVar2 == 0) {
      this_00 = (CTcConstVal *)
                (**(code **)(*in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase +
                            8))();
      iVar3 = CTcConstVal::is_ctc(this_00);
      if (iVar3 == 0) {
        CTPNStmBase::log_warning(in_RDI,0x2d02);
      }
      if (in_RDI[1].file_ != (CTcTokFileDesc *)0x0) {
        CTPNStmBase::gen_code_substm
                  ((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),
                   (CTPNStm *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      }
    }
    else {
      if (in_RDI[1].file_ != (CTcTokFileDesc *)0x0) {
        CTPNStmBase::log_warning(in_RDI,0x2d01);
      }
      if (in_RDI[1].next_stm_ != (CTPNStm *)0x0) {
        CTPNStmBase::gen_code_substm
                  ((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),
                   (CTPNStm *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      }
    }
  }
  return;
}

Assistant:

void CTPNStmIf::gen_code(int, int)
{
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   if the condition has a constant value, don't bother generating
     *   code for both branches 
     */
    if (cond_expr_->is_const())
    {
        int val;

        /* determine whether it's true or false */
        val = cond_expr_->get_const_val()->get_val_bool();
        
        /* 
         *   Warn about it if it's always false (in which case the 'then'
         *   code is unreachable); or it's always true and we have an
         *   'else' part (since the 'else' part is unreachable).  Don't
         *   warn if it's true and there's no 'else' part, since this
         *   merely means that there's some redundant source code, but
         *   will have no effect on the generated code.  
         */
        if (!val)
        {
            /* 
             *   It's false - the 'then' part cannot be executed.  If this
             *   isn't a compile-time constant expression, warn about it.
             */
            if (!cond_expr_->get_const_val()->is_ctc())
                log_warning(TCERR_IF_ALWAYS_FALSE);

            /* generate the 'else' part if there is one */
            if (else_part_ != 0)
                gen_code_substm(else_part_);
        }
        else
        {
            /* it's true - the 'else' part cannot be executed */
            if (else_part_ != 0)
                log_warning(TCERR_IF_ALWAYS_TRUE);

            /* generate the 'then' part */
            if (then_part_ != 0)
                gen_code_substm(then_part_);
        }

        /* we're done */
        return;
    }

    /*
     *   If both the 'then' and 'else' parts are null statements, we're
     *   evaluating the condition purely for side effects.  Simply
     *   evaluate the condition in this case, since there's no need to so
     *   much as test the condition once evaluated. 
     */
    if (then_part_ == 0 && else_part_ == 0)
    {
        /* generate the condition, discarding the result */
        cond_expr_->gen_code(TRUE, TRUE);

        /* we're done */
        return;
    }

    /* 
     *   The condition is non-constant, and we have at least one subclause,
     *   so we must evaluate the condition expression.  To minimize the
     *   amount of jumping, check whether we have a true part, else part, or
     *   both, and generate the branching accordingly.  
     */
    if (then_part_ != 0)
    {
        CTcCodeLabel *lbl_else;
        CTcCodeLabel *lbl_end;

        /*
         *   We have a true part, so we will want to evaluate the expression
         *   and jump past the true part if the expression is false.  Create
         *   a label for the false branch.  
         */
        lbl_else = G_cs->new_label_fwd();

        /* generate the condition expression */
        cond_expr_->gen_code_cond(0, lbl_else);

        /* generate the 'then' part */
        gen_code_substm(then_part_);

        /* if there's an 'else' part, generate it */
        if (else_part_ != 0)
        {
            /* at the end of the 'then' part, jump past the 'else' part */
            lbl_end = gen_jump_ahead(OPC_JMP);

            /* this is the start of the 'else' part */
            def_label_pos(lbl_else);

            /* generate the 'else' part */
            gen_code_substm(else_part_);

            /* set the label for the jump over the 'else' part */
            def_label_pos(lbl_end);
        }
        else
        {
            /* 
             *   there's no 'else' part - set the label for the jump past the
             *   'then' part 
             */
            def_label_pos(lbl_else);
        }
    }
    else
    {
        CTcCodeLabel *lbl_end;

        /* 
         *   There's no 'then' part, so there must be an 'else' part (we
         *   wouldn't have gotten this far if both 'then' and 'else' are
         *   empty).  To minimize branching, evaluate the condition and jump
         *   past the 'else' part if the condition is true, falling through
         *   to the 'else' part otherwise.  Create a label for the end of the
         *   statement, which is also the empty 'then' part.  
         */
        lbl_end = G_cs->new_label_fwd();

        /* evaluate the condition and jump to the end if it's true */
        cond_expr_->gen_code_cond(lbl_end, 0);

        /* generate the 'else' part */
        gen_code_substm(else_part_);

        /* set the label for the jump over the 'else' part */
        def_label_pos(lbl_end);
    }
}